

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbrNtbdd.c
# Opt level: O2

DdNode * Bbr_NodeGlobalBdds_rec
                   (DdManager *dd,Aig_Obj_t *pNode,int nBddSizeMax,int fDropInternal,
                   ProgressBar *pProgress,int *pCounter,int fVerbose)

{
  uint uVar1;
  uint uVar2;
  DdNode *pDVar3;
  DdNode *pDVar4;
  DdNode *n;
  char *__assertion;
  
  if (((ulong)pNode & 1) != 0) {
    __assertion = "!Aig_IsComplement(pNode)";
    uVar1 = 0x36;
LAB_0075a588:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/bbr/bbrNtbdd.c"
                  ,uVar1,
                  "DdNode *Bbr_NodeGlobalBdds_rec(DdManager *, Aig_Obj_t *, int, int, ProgressBar *, int *, int)"
                 );
  }
  uVar1 = Cudd_ReadKeys(dd);
  uVar2 = Cudd_ReadDead(dd);
  if ((uint)nBddSizeMax < uVar1 - uVar2) {
    if (fVerbose != 0) {
      printf("The number of live nodes reached %d.\n",(ulong)(uint)nBddSizeMax);
    }
    fflush(_stdout);
  }
  else {
    n = (DdNode *)(pNode->field_5).pData;
    if (n != (DdNode *)0x0) {
LAB_0075a44c:
      uVar1 = ((uint)(*(ulong *)&pNode->field_0x18 >> 6) & 0x3ffffff) + 0x3ffffff;
      *(ulong *)&pNode->field_0x18 =
           *(ulong *)&pNode->field_0x18 & 0xffffffff0000003f | (ulong)(uVar1 * 0x40);
      if (fDropInternal == 0) {
        return n;
      }
      if ((uVar1 & 0x3ffffff) != 0) {
        return n;
      }
      Cudd_Deref(n);
      (pNode->field_5).pData = (void *)0x0;
      return n;
    }
    pDVar3 = Bbr_NodeGlobalBdds_rec
                       (dd,(Aig_Obj_t *)((ulong)pNode->pFanin0 & 0xfffffffffffffffe),nBddSizeMax,
                        fDropInternal,pProgress,pCounter,fVerbose);
    if (pDVar3 != (DdNode *)0x0) {
      Cudd_Ref(pDVar3);
      pDVar4 = Bbr_NodeGlobalBdds_rec
                         (dd,(Aig_Obj_t *)((ulong)pNode->pFanin1 & 0xfffffffffffffffe),nBddSizeMax,
                          fDropInternal,pProgress,pCounter,fVerbose);
      if (pDVar4 != (DdNode *)0x0) {
        Cudd_Ref(pDVar4);
        pDVar3 = (DdNode *)((ulong)((uint)pNode->pFanin0 & 1) ^ (ulong)pDVar3);
        pDVar4 = (DdNode *)((ulong)((uint)pNode->pFanin1 & 1) ^ (ulong)pDVar4);
        n = Cudd_bddAnd(dd,pDVar3,pDVar4);
        Cudd_Ref(n);
        Cudd_RecursiveDeref(dd,pDVar3);
        Cudd_RecursiveDeref(dd,pDVar4);
        *pCounter = *pCounter + 1;
        if ((pNode->field_5).pData != (void *)0x0) {
          __assertion = "Aig_ObjGlobalBdd(pNode) == NULL";
          uVar1 = 0x54;
          goto LAB_0075a588;
        }
        (pNode->field_5).pData = n;
        goto LAB_0075a44c;
      }
    }
  }
  return (DdNode *)0x0;
}

Assistant:

DdNode * Bbr_NodeGlobalBdds_rec( DdManager * dd, Aig_Obj_t * pNode, int nBddSizeMax, int fDropInternal, ProgressBar * pProgress, int * pCounter, int fVerbose )
{
    DdNode * bFunc, * bFunc0, * bFunc1;
    assert( !Aig_IsComplement(pNode) );
    if ( Cudd_ReadKeys(dd)-Cudd_ReadDead(dd) > (unsigned)nBddSizeMax )
    {
//        Extra_ProgressBarStop( pProgress );
        if ( fVerbose )
        printf( "The number of live nodes reached %d.\n", nBddSizeMax );
        fflush( stdout );
        return NULL;
    }
    // if the result is available return
    if ( Aig_ObjGlobalBdd(pNode) == NULL )
    {
        // compute the result for both branches
        bFunc0 = Bbr_NodeGlobalBdds_rec( dd, Aig_ObjFanin0(pNode), nBddSizeMax, fDropInternal, pProgress, pCounter, fVerbose ); 
        if ( bFunc0 == NULL )
            return NULL;
        Cudd_Ref( bFunc0 );
        bFunc1 = Bbr_NodeGlobalBdds_rec( dd, Aig_ObjFanin1(pNode), nBddSizeMax, fDropInternal, pProgress, pCounter, fVerbose ); 
        if ( bFunc1 == NULL )
            return NULL;
        Cudd_Ref( bFunc1 );
        bFunc0 = Cudd_NotCond( bFunc0, Aig_ObjFaninC0(pNode) );
        bFunc1 = Cudd_NotCond( bFunc1, Aig_ObjFaninC1(pNode) );
        // get the final result
        bFunc = Cudd_bddAnd( dd, bFunc0, bFunc1 );   Cudd_Ref( bFunc );
        Cudd_RecursiveDeref( dd, bFunc0 );
        Cudd_RecursiveDeref( dd, bFunc1 );
        // add the number of used nodes
        (*pCounter)++;
        // set the result
        assert( Aig_ObjGlobalBdd(pNode) == NULL );
        Aig_ObjSetGlobalBdd( pNode, bFunc );
        // increment the progress bar
//        if ( pProgress )
//            Extra_ProgressBarUpdate( pProgress, *pCounter, NULL );
    }
    // prepare the return value
    bFunc = Aig_ObjGlobalBdd(pNode);
    // dereference BDD at the node
    if ( --pNode->nRefs == 0 && fDropInternal )
    {
        Cudd_Deref( bFunc );
        Aig_ObjSetGlobalBdd( pNode, NULL );
    }
    return bFunc;
}